

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O1

void __thiscall
kj::Canceler::AdapterImpl<unsigned_int>::cancel(AdapterImpl<unsigned_int> *this,Exception *e)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  
  (*this->fulfiller->_vptr_PromiseFulfiller[1])();
  pDVar1 = (this->inner).super_PromiseBase.node.disposer;
  pPVar2 = (this->inner).super_PromiseBase.node.ptr;
  (this->inner).super_PromiseBase.node.disposer = (Disposer *)0x0;
  (this->inner).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  if (pPVar2 != (PromiseNode *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
    return;
  }
  return;
}

Assistant:

void cancel(Exception&& e) override {
      fulfiller.reject(kj::mv(e));
      inner = nullptr;
    }